

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token)

{
  bool bVar1;
  ushort uVar2;
  ValueHolder *pVVar3;
  ValueHolder VVar4;
  _Elt_pointer ppVVar5;
  Location pCVar6;
  undefined4 uVar7;
  bool bVar8;
  _Elt_pointer ppVVar9;
  _Elt_pointer ppVVar10;
  Value decoded;
  string decoded_string;
  ValueHolder local_68;
  ushort local_60;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  bVar8 = decodeString(this,token,&local_40);
  if (bVar8) {
    Value::Value((Value *)&local_68,&local_40);
    uVar7 = _local_60;
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar9 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar3 = &ppVVar9[-1]->value_;
    bVar1 = pVVar3[1].bool_;
    pVVar3[1].bool_ = local_60._0_1_;
    _local_60 = CONCAT31(stack0xffffffffffffffa1,bVar1);
    VVar4 = *pVVar3;
    *pVVar3 = local_68;
    uVar2 = *(ushort *)(pVVar3 + 1);
    *(ushort *)(pVVar3 + 1) = uVar2 & 0xfeff | local_60 & 0x100;
    _local_60 = CONCAT22(SUB42(uVar7,2),local_60 & 0xfeff | uVar2 & 0x100);
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar10 = ppVVar9;
    if (ppVVar9 == ppVVar5) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar6 = this->begin_;
    ppVVar10[-1]->start_ = (long)token->start_ - (long)pCVar6;
    if (ppVVar9 == ppVVar5) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar9[-1]->limit_ = (long)token->end_ - (long)pCVar6;
    local_68 = VVar4;
    Value::~Value((Value *)&local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return bVar8;
}

Assistant:

bool Reader::decodeString(Token& token) {
  JSONCPP_STRING decoded_string;
  if (!decodeString(token, decoded_string))
    return false;
  Value decoded(decoded_string);
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}